

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

unique_ptr<Flag,_std::default_delete<Flag>_>
addOption<Flag,char_const(&)[19]>
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*>_>_>
           *coll,char (*args) [19])

{
  pointer sw;
  char (*args_local) [19];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*>_>_>
  *coll_local;
  __single_object *instance;
  
  std::make_unique<Flag,char_const(&)[19]>((char (*) [19])coll);
  sw = std::unique_ptr<Flag,_std::default_delete<Flag>_>::get
                 ((unique_ptr<Flag,_std::default_delete<Flag>_> *)coll);
  mapOption((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Switch_*>_>_>
             *)args,&sw->super_Switch);
  return (__uniq_ptr_data<Flag,_std::default_delete<Flag>,_true,_true>)
         (__uniq_ptr_data<Flag,_std::default_delete<Flag>,_true,_true>)coll;
}

Assistant:

auto addOption(std::unordered_map<std::string, Switch*>& coll, Args&& ...args) -> std::unique_ptr<T> {
    static_assert(std::is_base_of_v<Switch, T>, "T must be derived from Switch");

    auto instance = std::make_unique<T>(std::forward<Args>(args)...);
    mapOption(coll, instance.get());

    return instance;
}